

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readdata.cpp
# Opt level: O3

int __thiscall ReadData::decode(ReadData *this,int desc)

{
  BUFF *buff;
  int iVar1;
  int iVar2;
  uchar headbuff [25];
  uchar auStack_38 [32];
  
  buff = &this->databuff;
  iVar1 = ReadSocketData(this,buff,desc);
  iVar2 = -1;
  if (iVar1 == 0) {
    ReadHead(this,buff,auStack_38);
    iVar2 = ReadMessage(this,buff,auStack_38);
  }
  return iVar2;
}

Assistant:

int ReadData::decode(int desc) {
    int flag;

    flag = ReadSocketData(databuff, desc);
    if(flag != 0)
        return flag;

    unsigned char headbuff[25];
    flag = ReadHead(databuff, headbuff);
    if(flag != 0)
        return flag;

    flag = ReadMessage(databuff, headbuff);
    return flag;
}